

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

bool __thiscall
QTableModel::insertColumns(QTableModel *this,int column,int count,QModelIndex *param_3)

{
  uint uVar1;
  qsizetype qVar2;
  bool bVar3;
  ulong uVar4;
  ulong i;
  ulong uVar5;
  long in_FS_OFFSET;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < column && 0 < count) {
    i = (ulong)(uint)column;
    if (i <= (ulong)(this->horizontalHeaderItems).d.size) {
      local_50 = 0xffffffffffffffff;
      local_48 = 0;
      uStack_40 = 0;
      QAbstractItemModel::beginInsertColumns((QModelIndex *)this,(int)&local_50,column);
      uVar1 = (uint)(this->verticalHeaderItems).d.size;
      qVar2 = (this->horizontalHeaderItems).d.size;
      uVar5 = 0;
      QList<QTableWidgetItem_*>::insert
                (&this->horizontalHeaderItems,i,(ulong)(uint)count,(parameter_type)0x0);
      if ((int)qVar2 == 0) {
        QList<QTableWidgetItem_*>::resize(&this->tableItems,(long)(int)(uVar1 * count));
      }
      else {
        uVar4 = (ulong)uVar1;
        if ((int)uVar1 < 1) {
          uVar4 = uVar5;
        }
        for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
          QList<QTableWidgetItem_*>::insert
                    (&this->tableItems,(this->horizontalHeaderItems).d.size * uVar5 + i,
                     (ulong)(uint)count,(parameter_type)0x0);
        }
      }
      QAbstractItemModel::endInsertColumns();
      bVar3 = true;
      goto LAB_005348b6;
    }
  }
  bVar3 = false;
LAB_005348b6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QTableModel::insertColumns(int column, int count, const QModelIndex &)
{
    if (count < 1 || column < 0 || column > horizontalHeaderItems.size())
        return false;

    beginInsertColumns(QModelIndex(), column, column + count - 1);
    int rc = verticalHeaderItems.size();
    int cc = horizontalHeaderItems.size();
    horizontalHeaderItems.insert(column, count, 0);
    if (cc == 0)
        tableItems.resize(rc * count);
    else
        for (int row = 0; row < rc; ++row)
            tableItems.insert(tableIndex(row, column), count, 0);
    endInsertColumns();
    return true;
}